

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  bool bVar1;
  InputLess<tcu::Matrix<float,_4,_2>_> local_1a;
  InputLess<tcu::Matrix<float,_4,_2>_> local_19;
  
  bVar1 = InputLess<tcu::Matrix<float,_4,_2>_>::operator()
                    (&local_1a,(Matrix<float,_4,_2> *)in1,(Matrix<float,_4,_2> *)in2);
  if (!bVar1) {
    InputLess<tcu::Matrix<float,_4,_2>_>::operator()
              (&local_19,(Matrix<float,_4,_2> *)in2,(Matrix<float,_4,_2> *)in1);
  }
  return bVar1;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}